

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringUpperLowerMethod::~StringUpperLowerMethod(StringUpperLowerMethod *this)

{
  StringUpperLowerMethod *this_local;
  
  ~StringUpperLowerMethod(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

StringUpperLowerMethod(Compilation& comp, const std::string& name, bool upper) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 0, {}, comp.getStringType(), true),
        upper(upper) {}